

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O0

void * worker_thread_test_evict_by_LRU(void *arg)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  context *ctx;
  void *arg_local;
  
  iVar1 = vmemcache_evict(*(undefined8 *)((long)arg + 8),0);
  if (iVar1 == 0) {
    do {
      iVar1 = vmemcache_evict(*(undefined8 *)((long)arg + 8),0);
    } while (iVar1 == 0);
    LOCK();
    keep_running = 0;
    UNLOCK();
    return (void *)0x0;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
          ,0x1a0,"worker_thread_test_evict_by_LRU");
  __stream = _stderr;
  uVar2 = vmemcache_errormsg();
  fprintf(__stream,"vmemcache_evict: %s",uVar2);
  fprintf(_stderr,"\n");
  abort();
}

Assistant:

static void *
worker_thread_test_evict_by_LRU(void *arg)
{
	struct context *ctx = arg;

	/* at least one entry has to be evicted successfully */
	if (vmemcache_evict(ctx->cache, NULL, 0))
		UT_FATAL("vmemcache_evict: %s", vmemcache_errormsg());

	/* try to evict all other entries */
	while (vmemcache_evict(ctx->cache, NULL, 0) == 0)
		;

	__atomic_store_n(&keep_running, 0, __ATOMIC_SEQ_CST);

	return NULL;
}